

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Value * __thiscall cashew::Value::setArray(Value *this,ArrayStorage *a)

{
  ArrayStorage *pAVar1;
  ArrayStorage *a_local;
  Value *this_local;
  
  free(this,a);
  this->type = Array;
  pAVar1 = GlobalMixedArena::alloc<cashew::ArrayStorage>((GlobalMixedArena *)&arena);
  (this->field_1).arr = pAVar1;
  pAVar1 = (this->field_1).arr;
  (pAVar1->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data =
       (a->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data;
  (pAVar1->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements =
       (a->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements;
  (pAVar1->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).allocatedElements =
       (a->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).allocatedElements;
  return this;
}

Assistant:

Value& setArray(ArrayStorage& a) {
    free();
    type = Array;
    arr = arena.alloc<ArrayStorage>();
    *arr = a;
    return *this;
  }